

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConstraintMacro.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5523c::TestTimeConstraintMacroUsesCorrectInfo::
~TestTimeConstraintMacroUsesCorrectInfo(TestTimeConstraintMacroUsesCorrectInfo *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST (TimeConstraintMacroUsesCorrectInfo)
{
    int testLine = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

        UNITTEST_TIME_CONSTRAINT(10); testLine = __LINE__;
        UnitTest::TimeHelpers::SleepMs(20);
    }

	using namespace std;

    CHECK_EQUAL(1, reporter.testFailedCount);
    CHECK(strstr(reporter.lastFailedFile, __FILE__));
    CHECK_EQUAL(testLine, reporter.lastFailedLine);
    CHECK(strstr(reporter.lastFailedTest, "TimeConstraintMacroUsesCorrectInfo"));
}